

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

void __thiscall
StatisticsWriter::writeHistograms
          (StatisticsWriter *this,ostream *stream,MultivariateTracker *tracker)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  long index;
  string name;
  string header;
  
  iVar1 = (int)(((long)(tracker->_statistics).
                       super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(tracker->_statistics).
                      super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0xe8);
  if (iVar1 == 0) {
    header._M_dataplus._M_p = (pointer)&header.field_2;
    std::__cxx11::string::_M_construct((string *)&header,0x14,'=');
    poVar2 = std::operator<<((ostream *)stream,(string *)this);
    poVar2 = std::operator<<(poVar2,(string *)&header);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)stream,(string *)this);
    poVar2 = std::operator<<(poVar2,0x20);
    *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 10;
    poVar2 = std::operator<<(poVar2,"Histograms");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)stream,(string *)this);
    poVar2 = std::operator<<(poVar2,(string *)&header);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)stream,(string *)this);
    poVar2 = std::operator<<(poVar2,"No valid data");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&header);
  }
  else {
    index = 0;
    lVar3 = (long)iVar1;
    if ((long)iVar1 < 1) {
      lVar3 = index;
    }
    for (; lVar3 != index; index = index + 1) {
      MultivariateTracker::getName_abi_cxx11_(&name,tracker,index);
      MultivariateTracker::getHistogram((DynamicHistogram<double> *)&header,tracker,index);
      writeHistogram<double>(this,stream,&name,(DynamicHistogram<double> *)&header);
      DynamicHistogram<double>::~DynamicHistogram((DynamicHistogram<double> *)&header);
      std::__cxx11::string::~string((string *)&name);
    }
  }
  return;
}

Assistant:

void
    writeHistograms(std::ostream & stream,
                    MultivariateTracker & tracker)
    {
        
        int numDim = tracker.getDimension();

        // Print no data header
        if (numDim == 0)
        {
            int totalWidth = 20;
            std::string header(totalWidth,'='); 
            stream << this->_comment << header << std::endl;
            stream << this->_comment << std::setfill (' ') << std::setw (totalWidth/2) << "Histograms" << std::endl;
            stream << this->_comment << header << std::endl;
            stream << this->_comment << "No valid data" << std::endl;
            return;
        }

        for (long i = 0; i < numDim; i++)
        {
            const std::string name = tracker.getName(i);
            DynamicHistogram<double> histogram = tracker.getHistogram(i);
            this->writeHistogram<double>(stream, name, histogram);
        }

        return;
    }